

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_type_sync_read
          (t_rs_generator *this,string *type_var,t_type *ttype,bool is_boxed)

{
  int iVar1;
  t_map *ptVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var;
  undefined8 *puVar4;
  string sStack_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  do {
    iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])(ttype);
    if ((char)iVar1 != '\0') {
      switch(*(undefined4 *)&(((t_map *)ttype)->super_t_container).cpp_name_._M_dataplus._M_p) {
      case 0:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = "cannot read field of type TYPE_VOID from input protocol";
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      case 1:
        iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[7])
                          (ttype);
        if ((char)iVar1 == '\0') {
          t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
          poVar3 = std::operator<<(poVar3,"let ");
          poVar3 = std::operator<<(poVar3,(string *)type_var);
          poVar3 = std::operator<<(poVar3," = i_prot.read_string()?;");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
        else {
          t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
          poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
          poVar3 = std::operator<<(poVar3,"let ");
          poVar3 = std::operator<<(poVar3,(string *)type_var);
          poVar3 = std::operator<<(poVar3," = i_prot.read_bytes()?;");
          std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        }
        break;
      case 2:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = i_prot.read_bool()?;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      case 3:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = i_prot.read_i8()?;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      case 4:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = i_prot.read_i16()?;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      case 5:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = i_prot.read_i32()?;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      case 6:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = i_prot.read_i64()?;");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      case 7:
        t_generator::indent_abi_cxx11_(&sStack_88,&this->super_t_generator);
        poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_88);
        poVar3 = std::operator<<(poVar3,"let ");
        poVar3 = std::operator<<(poVar3,(string *)type_var);
        poVar3 = std::operator<<(poVar3," = OrderedFloat::from(i_prot.read_double()?);");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        break;
      default:
switchD_0029ff28_default:
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])
                          (ttype);
        std::operator+(__return_storage_ptr__,"cannot read unsupported type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar1));
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
LAB_002a00d6:
      std::__cxx11::string::~string((string *)&sStack_88);
      return;
    }
    iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[9])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])
                        (ttype);
      if ((((char)iVar1 == '\0') &&
          (iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb]
                   )(ttype), (char)iVar1 == '\0')) &&
         (iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])
                            (ttype), (char)iVar1 == '\0')) {
        iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])
                          (ttype);
        if ((char)iVar1 != '\0') {
          render_map_sync_read(this,(t_map *)ttype,type_var);
          return;
        }
        iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])
                          (ttype);
        if ((char)iVar1 != '\0') {
          render_set_sync_read(this,(t_set *)ttype,type_var);
          return;
        }
        iVar1 = (*(((t_map *)ttype)->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])
                          (ttype);
        if ((char)iVar1 != '\0') {
          render_list_sync_read(this,(t_list *)ttype,type_var);
          return;
        }
        goto switchD_0029ff28_default;
      }
      to_rust_type_abi_cxx11_(&local_68,this,ttype);
      std::operator+(&sStack_88,&local_68,"::read_from_in_protocol(i_prot)?");
      std::__cxx11::string::~string((string *)&local_68);
      if ((is_boxed & 1U) == 0) {
        std::__cxx11::string::string((string *)&local_68,(string *)&sStack_88);
      }
      else {
        std::operator+(&local_48,"Box::new(",&sStack_88);
        std::operator+(&local_68,&local_48,")");
      }
      std::__cxx11::string::operator=((string *)&sStack_88,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if ((is_boxed & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_48);
      }
      t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
      poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_68);
      poVar3 = std::operator<<(poVar3,"let ");
      poVar3 = std::operator<<(poVar3,(string *)type_var);
      poVar3 = std::operator<<(poVar3," = ");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_88);
      poVar3 = std::operator<<(poVar3,";");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_68);
      goto LAB_002a00d6;
    }
    ptVar2 = (t_map *)t_typedef::get_type((t_typedef *)ttype);
    is_boxed = *(bool *)&((t_map *)ttype)->key_type_;
    ttype = (t_type *)ptVar2;
  } while( true );
}

Assistant:

void t_rs_generator::render_type_sync_read(const string &type_var, t_type *ttype, bool is_boxed) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_VOID:
      throw "cannot read field of type TYPE_VOID from input protocol";
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_bytes()?;" << endl;
      } else {
        f_gen_ << indent() << "let " << type_var << " = i_prot.read_string()?;" << endl;
      }
      return;
    case t_base_type::TYPE_BOOL:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_bool()?;" << endl;
      return;
    case t_base_type::TYPE_I8:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i8()?;" << endl;
      return;
    case t_base_type::TYPE_I16:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i16()?;" << endl;
      return;
    case t_base_type::TYPE_I32:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i32()?;" << endl;
      return;
    case t_base_type::TYPE_I64:
      f_gen_ << indent() << "let " << type_var << " = i_prot.read_i64()?;" << endl;
      return;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << indent() << "let " << type_var << " = OrderedFloat::from(i_prot.read_double()?);" << endl;
      return;
    }
  } else if (ttype->is_typedef()) {
    // FIXME: not a fan of separate `is_boxed` parameter
    // This is problematic because it's an optional parameter, and only comes
    // into play once. The core issue is that I lose an important piece of type
    // information (whether the type is a fwd ref) by unwrapping the typedef'd
    // type and making the recursive call using it. I can't modify or wrap the
    // generated string after the fact because it's written directly into the file,
    // so I have to pass this parameter along. Going with this approach because it
    // seems like the lowest-cost option to easily support recursive types.
    t_typedef* ttypedef = (t_typedef*)ttype;
    render_type_sync_read(type_var, ttypedef->get_type(), ttypedef->is_forward_typedef());
    return;
  } else if (ttype->is_enum() || ttype->is_struct() || ttype->is_xception()) {
    string read_call(to_rust_type(ttype) + "::read_from_in_protocol(i_prot)?");
    read_call = is_boxed ? "Box::new(" + read_call + ")" : read_call;
    f_gen_
      << indent()
      << "let " << type_var << " = " <<  read_call << ";"
      << endl;
    return;
  } else if (ttype->is_map()) {
    render_map_sync_read((t_map *) ttype, type_var);
    return;
  } else if (ttype->is_set()) {
    render_set_sync_read((t_set *) ttype, type_var);
    return;
  } else if (ttype->is_list()) {
    render_list_sync_read((t_list *) ttype, type_var);
    return;
  }

  throw "cannot read unsupported type " + ttype->get_name();
}